

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Session::enforceNoUsedTokens(Session *this)

{
  pointer pTVar1;
  runtime_error *this_00;
  pointer pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar2 = (this->m_unusedTokens).
           super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->m_unusedTokens).
           super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar2 == pTVar1) {
    return;
  }
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  for (; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    std::operator+(&local_50,"  unrecognised option: ",&pTVar2->data);
    std::operator+(&local_90,&local_50,"\n");
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::substr((ulong)&local_90,(ulong)&msg);
  std::runtime_error::runtime_error(this_00,(string *)&local_90);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }